

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

Var Js::JavascriptProxy::FunctionCallTrap(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  RecyclableObject *pRVar2;
  SparseArraySegmentBase *aValue;
  ThreadContext *pTVar3;
  code *pcVar4;
  CallInfo CVar5;
  CallInfo CVar6;
  bool bVar7;
  bool bVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  JavascriptArray *pJVar11;
  JavascriptFunction *this;
  Var pvVar12;
  JavascriptArray *pJVar13;
  FunctionInfo *pFVar14;
  JavascriptMethod entryPoint;
  int iVar15;
  Type TVar16;
  PCWSTR varName;
  uint uVar17;
  Arguments *pAVar18;
  PropertyId methodId;
  ushort uVar19;
  uint uVar20;
  long lVar21;
  int in_stack_00000010;
  Var in_stack_00000018;
  Arguments local_f8;
  Arguments local_e8;
  Arguments local_d8;
  RecyclableObject *local_c8;
  Var stackArgs [8];
  CallInfo local_50;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pAVar18 = &local_f8;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_50._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x837,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar7) goto LAB_00d05f89;
    *puVar10 = 0;
  }
  callInfo_local = local_50;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_50);
  CVar5 = callInfo_local;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_f8.Info = callInfo_local;
  local_f8.Values = &stack0x00000018;
  bVar7 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_f8);
  CVar6 = callInfo_local;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x83e,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar8) goto LAB_00d05f89;
    *puVar10 = 0;
  }
  bVar8 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(function);
  if (bVar8) {
    pJVar11 = (JavascriptArray *)VarTo<Js::JavascriptProxy,Js::RecyclableObject>(function);
    pRVar2 = ((Type *)&(pJVar11->super_ArrayObject).length)->ptr;
    aValue = (pJVar11->head).ptr;
    bVar8 = Memory::Recycler::IsHeapEnumInProgress(pSVar1->recycler);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x851,"(!scriptContext->IsHeapEnumInProgress())",
                                  "!scriptContext->IsHeapEnumInProgress()");
      if (!bVar8) goto LAB_00d05f89;
      *puVar10 = 0;
    }
    pJVar13 = pJVar11;
    if (((ulong)CVar5 & 0x40000000) != 0) {
      pJVar13 = (JavascriptArray *)(&stack0x00000018)[local_50._0_4_ & 0xffffff];
    }
    methodId = 0x66;
    if (((uint)callInfo_local._0_4_ >> 0x18 & 1) == 0) {
      methodId = 0x4e;
    }
    this = GetMethodHelper((JavascriptProxy *)pJVar11,methodId,pSVar1);
    bVar8 = JavascriptConversion::IsCallable((RecyclableObject *)aValue);
    if (bVar8) {
      if (this == (JavascriptFunction *)0x0) {
        if (0xfffe < (callInfo_local._0_4_ & 0xffffff)) {
          JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec52,(PCWSTR)0x0);
        }
        if ((callInfo_local._0_4_ >> 0x18 & 1) == 0) {
          stackArgs[7] = (Var)0x0;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor((RecyclableObject *)aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec40,L"construct");
          }
          if ((!bVar7) || (stackArgs[7] = in_stack_00000018, in_stack_00000018 == (Var)0x0)) {
            pTVar3 = pSVar1->threadContext;
            bVar7 = pTVar3->reentrancySafeOrHandled;
            pTVar3->reentrancySafeOrHandled = true;
            stackArgs[7] = JavascriptOperators::NewScObjectNoCtorCommon(pJVar11,pSVar1,false);
            pTVar3->reentrancySafeOrHandled = bVar7;
            in_stack_00000018 = stackArgs[7];
          }
        }
        iVar15 = (CVar6._0_4_ & 0x1000000) + (CVar5._0_4_ & 0x40000000);
        uVar20 = callInfo_local._0_4_;
        if ((iVar15 != 0) && (uVar19 = callInfo_local._0_2_ + 1, uVar20 = (uint)uVar19, uVar19 == 0)
           ) {
          ::Math::DefaultOverflowPolicy();
        }
        uVar19 = (ushort)uVar20;
        uVar20 = uVar20 & 0xffff;
        if (uVar20 < (callInfo_local._0_4_ & 0xffff)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                      ,0x895,"(newCount >= (ushort)args.Info.Count)",
                                      "newCount >= (ushort)args.Info.Count");
          if (!bVar7) goto LAB_00d05f89;
          *puVar10 = 0;
        }
        if (uVar19 < 9) {
          args.super_Arguments.Values = &local_c8;
        }
        else {
          ThreadContext::ProbeStack
                    (pSVar1->threadContext,(ulong)(uVar20 * 8) + 0xc00,pSVar1,(PVOID)0x0);
          pAVar18 = (Arguments *)((long)&local_f8 - (ulong)(uVar20 * 8 + 0xf & 0xfffffff0));
          args.super_Arguments.Values = (Type)pAVar18;
        }
        TVar16 = (Type)((ulong)callInfo_local & 0xffffffff | 0x48000000);
        if (iVar15 == 0) {
          TVar16 = (Type)((ulong)callInfo_local & 0xffffffff);
        }
        uVar17 = callInfo_local._0_4_ & 0xffff;
        if (((ulong)callInfo_local & 0xffff) != 0) {
          *(undefined8 *)((long)pAVar18 + -8) = 0xd05d3a;
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          lVar21 = 0;
          do {
            if (uVar20 < uVar17) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05d5a;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05d7d;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ac,"(newCount >= ((ushort)args.Info.Count))",
                                          "newCount >= ((ushort)args.Info.Count)");
              if (!bVar7) goto LAB_00d05f89;
              *puVar10 = 0;
            }
            if (uVar19 <= (ushort)lVar21) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05d9a;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05dbd;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ad,"(argCount < newCount)","argCount < newCount");
              if (!bVar7) goto LAB_00d05f89;
              *puVar10 = 0;
            }
            if ((uint)(ushort)callInfo_local._0_2_ <= (uint)lVar21) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05ddd;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05e00;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8ae,"(argCount < (ushort)args.Info.Count)",
                                          "argCount < (ushort)args.Info.Count");
              if (!bVar7) goto LAB_00d05f89;
              *puVar10 = 0;
            }
            if (uVar19 <= (ushort)lVar21) {
              AssertCount = AssertCount + 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05e1d;
              Throw::LogAssert();
              *puVar10 = 1;
              *(undefined8 *)((long)pAVar18 + -8) = 0xd05e40;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                          ,0x8b0,
                                          "(sizeof(Var*) * argCount < sizeof(void*) * newCount)",
                                          "sizeof(Var*) * argCount < sizeof(void*) * newCount");
              if (!bVar7) goto LAB_00d05f89;
              *puVar10 = 0;
            }
            args.super_Arguments.Values[lVar21] = (&stack0x00000018)[lVar21];
            lVar21 = lVar21 + 1;
            uVar17 = (uint)(ushort)callInfo_local._0_2_;
          } while (((uint)lVar21 & 0xffff) < uVar17);
        }
        if (iVar15 != 0) {
          if (uVar17 + 1 != uVar20) {
            AssertCount = AssertCount + 1;
            *(undefined8 *)((long)pAVar18 + -8) = 0xd05e9b;
            Throw::LogAssert();
            *(undefined8 *)((long)pAVar18 + -8) = 0xd05eab;
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            *(undefined8 *)((long)pAVar18 + -8) = 0xd05ed3;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                        ,0x8b6,"(newCount == ((ushort)args.Info.Count) + 1)",
                                        "newCount == ((ushort)args.Info.Count) + 1");
            if (!bVar7) {
LAB_00d05f89:
              pcVar4 = (code *)invalidInstructionException();
              (*pcVar4)();
            }
            *puVar10 = 0;
          }
          args.super_Arguments.Values[callInfo_local._0_4_ & 0xffffff] = pJVar13;
          *(undefined8 *)((long)pAVar18 + -8) = 0xd05f01;
          pFVar14 = JavascriptOperators::GetConstructorFunctionInfo(aValue,pSVar1);
          if ((pFVar14 != (FunctionInfo *)0x0) && ((pFVar14->attributes & ClassConstructor) != None)
             ) {
            *args.super_Arguments.Values = pJVar13;
          }
        }
        pTVar3 = pSVar1->threadContext;
        bVar7 = pTVar3->reentrancySafeOrHandled;
        pTVar3->reentrancySafeOrHandled = true;
        *(undefined8 *)((long)pAVar18 + -8) = 0xd05f35;
        entryPoint = RecyclableObject::GetEntryPoint((RecyclableObject *)aValue);
        local_e8.Values = args.super_Arguments.Values;
        local_e8.Info = TVar16;
        *(undefined8 *)((long)pAVar18 + -8) = 0xd05f58;
        pvVar12 = JavascriptFunction::CallFunction<true>
                            ((RecyclableObject *)aValue,entryPoint,&local_e8,false);
        pTVar3->reentrancySafeOrHandled = bVar7;
        if (((ulong)local_50 & 0x1000000) != 0) {
          *(undefined8 *)((long)pAVar18 + -8) = 0xd05f70;
          BVar9 = JavascriptOperators::IsObject(pvVar12);
          if (BVar9 == 0) {
            pvVar12 = stackArgs[7];
          }
        }
      }
      else {
        pJVar11 = JavascriptLibrary::CreateArray
                            ((pSVar1->super_ScriptContextBase).javascriptLibrary,
                             (local_50._0_4_ & 0xffffff) - 1);
        if (((ulong)local_50 & 0xfffffe) != 0) {
          uVar20 = 1;
          do {
            pvVar12 = Arguments::operator[]((Arguments *)&callInfo_local,uVar20);
            JavascriptArray::DirectSetItemAt<void*>(pJVar11,uVar20 - 1,pvVar12);
            uVar20 = uVar20 + 1;
          } while (uVar20 < (local_50._0_4_ & 0xffffff));
        }
        local_c8 = pRVar2;
        stackArgs[0] = aValue;
        if (((ulong)callInfo_local & 0x1000000) == 0) {
          stackArgs[1] = Arguments::operator[]((Arguments *)&callInfo_local,0);
          pJVar13 = pJVar11;
        }
        else {
          bVar8 = JavascriptOperators::IsConstructor((RecyclableObject *)aValue);
          if (!bVar8) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec00,(PCWSTR)0x0);
          }
          stackArgs[1] = pJVar11;
          if (bVar7 && ((ulong)CVar5 & 0x40000000) == 0) {
            pJVar13 = (JavascriptArray *)Arguments::operator[]((Arguments *)&callInfo_local,0);
          }
        }
        local_d8.Values = &local_c8;
        pTVar3 = pSVar1->threadContext;
        bVar7 = pTVar3->reentrancySafeOrHandled;
        pTVar3->reentrancySafeOrHandled = true;
        local_d8.Info = (Type)0x2000004;
        stackArgs[2] = pJVar13;
        pvVar12 = JavascriptFunction::CallFunction(this,&local_d8);
        pTVar3->reentrancySafeOrHandled = bVar7;
        if (((ulong)callInfo_local & 0x1000000) != 0) {
          BVar9 = JavascriptOperators::IsObject(pvVar12);
          if (BVar9 == 0) {
            JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea14,L"construct");
          }
        }
      }
      return pvVar12;
    }
  }
  else if (((ulong)callInfo_local & 0x1000000) != 0) {
    varName = L"construct";
    goto LAB_00d05fa1;
  }
  varName = L"call";
LAB_00d05fa1:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,varName);
}

Assistant:

Var JavascriptProxy::FunctionCallTrap(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        BOOL hasOverridingNewTarget = args.HasNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);
        bool isNewCall = args.IsNewCall() || hasOverridingNewTarget;

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (!VarIs<JavascriptProxy>(function))
        {
            if (args.Info.Flags & CallFlags_New)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("construct"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
            }
        }

        Var newTarget = nullptr;
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(function);
        Js::RecyclableObject *handlerObj = proxy->handler;
        Js::RecyclableObject *targetObj = proxy->target;

        JavascriptFunction* callMethod;
        Assert(!scriptContext->IsHeapEnumInProgress());

        // To conform with ES6 spec 7.3.13
        if (hasOverridingNewTarget)
        {
            newTarget = args.Values[callInfo.Count];
        }
        else
        {
            newTarget = proxy;
        }

        if (args.Info.Flags & CallFlags_New)
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::construct, scriptContext);
        }
        else
        {
            callMethod = proxy->GetMethodHelper(PropertyIds::apply, scriptContext);
        }
        if (!JavascriptConversion::IsCallable(targetObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction, _u("call"));
        }

        if (nullptr == callMethod)
        {
            // newCount is ushort. If args count is greater than or equal to 65535, an integer
            // too many arguments
            if (args.Info.Count >= USHORT_MAX) //check against CallInfo::kMaxCountArgs if newCount is ever made int
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            // in [[construct]] case, we don't need to check if the function is a constructor: the function should throw there.
            Var newThisObject = nullptr;
            if (args.Info.Flags & CallFlags_New)
            {
                if (!JavascriptOperators::IsConstructor(targetObj))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("construct"));
                }

                // args.Values[0] will be null in the case where NewTarget is initially provided by proxy.
                if (!isCtorSuperCall || !args.Values[0])
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        newThisObject = JavascriptOperators::NewScObjectNoCtorCommon(proxy, scriptContext, false);
                    }
                    END_SAFE_REENTRANT_CALL
                    args.Values[0] = newThisObject;
                }
                else
                {
                    newThisObject = args.Values[0];
                }
            }

            ushort newCount = (ushort)args.Info.Count;
            if (isNewCall)
            {
                newCount++;
                if (!newCount)
                {
                    ::Math::DefaultOverflowPolicy();
                }
            }
            AnalysisAssert(newCount >= (ushort)args.Info.Count);

            Var* newValues;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            if (newCount > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, newCount * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                newValues = (Var*)_alloca(newCount * sizeof(Var));
            }
            else
            {
                newValues = stackArgs;
            }

            CallInfo calleeInfo((CallFlags)(args.Info.Flags), args.Info.Count);
            if (isNewCall)
            {
                calleeInfo.Flags = (CallFlags)(calleeInfo.Flags | CallFlags_ExtraArg | CallFlags_NewTarget);
            }

            for (ushort argCount = 0; argCount < (ushort)args.Info.Count; argCount++)
            {
                AnalysisAssert(newCount >= ((ushort)args.Info.Count));
                AnalysisAssert(argCount < newCount);
                AnalysisAssert(argCount < (ushort)args.Info.Count);
                AnalysisAssert(sizeof(Var*) == sizeof(void*));
                AnalysisAssert(sizeof(Var*) * argCount < sizeof(void*) * newCount);
#pragma prefast(suppress:__WARNING_WRITE_OVERRUN, "This is a false positive, and all of the above analysis asserts still didn't convince prefast of that.")
                newValues[argCount] = args.Values[argCount];
            }
            if (isNewCall)
            {
                AnalysisAssert(newCount == ((ushort)args.Info.Count) + 1);
                newValues[args.Info.Count] = newTarget;

                // If the function we're calling is a class constructor, it expects newTarget
                // as the first arg so it knows how to construct "this". (We can leave the
                // extra copy of newTarget at the end of the arguments; it's harmless so
                // there's no need to introduce additional complexity here.)
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetObj, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    newValues[0] = newTarget;
                }
            }

            Js::Arguments arguments(calleeInfo, newValues);
            Var aReturnValue = nullptr;
            BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
            {
                aReturnValue = JavascriptFunction::CallFunction<true>(targetObj, targetObj->GetEntryPoint(), arguments);
            }
            END_SAFE_REENTRANT_CALL
            // If this is constructor call, return the actual object instead of function result
            if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
            {
                aReturnValue = newThisObject;
            }
            return aReturnValue;
        }

        JavascriptArray* argList = scriptContext->GetLibrary()->CreateArray(callInfo.Count - 1);
        for (uint i = 1; i < callInfo.Count; i++)
        {
            argList->DirectSetItemAt(i - 1, args[i]);
        }

        Var varArgs[4];
        CallInfo calleeInfo(CallFlags_Value, 4);
        Js::Arguments arguments(calleeInfo, varArgs);

        varArgs[0] = handlerObj;
        varArgs[1] = targetObj;
        if (args.Info.Flags & CallFlags_New)
        {
            if (!JavascriptOperators::IsConstructor(targetObj))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
            }

            varArgs[2] = argList;
            // 1st preference - overridden newTarget
            // 2nd preference - 'this' in case of super() call
            // 3rd preference - newTarget ( which is same as F)
            varArgs[3] = hasOverridingNewTarget ? newTarget :
                isCtorSuperCall ? args[0] : newTarget;
         }
        else
        {
            varArgs[2] = args[0];
            varArgs[3] = argList;
        }

        Var trapResult = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            trapResult = callMethod->CallFunction(arguments);
        }
        END_SAFE_REENTRANT_CALL
        if (args.Info.Flags & CallFlags_New)
        {
            if (!Js::JavascriptOperators::IsObject(trapResult))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_InconsistentTrapResult, _u("construct"));
            }
        }
        return trapResult;
    }